

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unity.c
# Opt level: O1

void UnityAssertFloatSpecial
               (UNITY_FLOAT actual,char *msg,UNITY_UINT lineNumber,UNITY_FLOAT_TRAIT_T style)

{
  UNITY_FLOAT_TRAIT_T UVar1;
  uint uVar2;
  UNITY_FLOAT_TRAIT_T UVar3;
  bool bVar4;
  char *trait_names [4];
  char *local_38 [4];
  
  local_38[2] = "NaN";
  local_38[3] = "Determinate";
  local_38[0] = "Infinity";
  local_38[1] = "Negative Infinity";
  if (Unity.CurrentTestIgnored != 0 || Unity.CurrentTestFailed != 0) {
    return;
  }
  UVar3 = style & UNITY_FLOAT_IS_INF;
  if (UNITY_FLOAT_IS_DET < style) {
    UVar1 = UVar3 ^ UNITY_FLOAT_IS_INF;
    local_38[0] = "Invalid Float Trait";
    uVar2 = 0;
    goto LAB_00102f32;
  }
  uVar2 = style >> 1;
  switch(style) {
  default:
    bVar4 = actual < INFINITY;
    break;
  case UNITY_FLOAT_IS_NOT_NEG_INF:
  case UNITY_FLOAT_IS_NEG_INF:
    bVar4 = -INFINITY < actual;
    break;
  case UNITY_FLOAT_IS_NOT_NAN:
  case UNITY_FLOAT_IS_NAN:
    UVar1 = (UNITY_FLOAT_TRAIT_T)NAN(actual);
    goto LAB_00102f32;
  case UNITY_FLOAT_IS_NOT_DET:
  case UNITY_FLOAT_IS_DET:
    UVar1 = (UNITY_FLOAT_TRAIT_T)((uint)ABS(actual) < 0x7f800000);
    goto LAB_00102f32;
  }
  UVar1 = (UNITY_FLOAT_TRAIT_T)!bVar4;
LAB_00102f32:
  if (UVar1 == UVar3) {
    return;
  }
  UnityTestResultsFailBegin(lineNumber);
  UnityPrint(" Expected ");
  if (UVar3 == UNITY_FLOAT_IS_NOT_INF) {
    UnityPrint("Not ");
  }
  UnityPrint(local_38[uVar2]);
  UnityPrint(" Was ");
  UnityPrintFloat(actual);
  UnityAddMsgIfSpecified(msg);
  Unity.CurrentTestFailed = 1;
  longjmp((__jmp_buf_tag *)Unity.AbortFrame,1);
}

Assistant:

void UnityAssertFloatSpecial(const UNITY_FLOAT actual,
                             const char* msg,
                             const UNITY_LINE_TYPE lineNumber,
                             const UNITY_FLOAT_TRAIT_T style)
{
    const char* trait_names[] = {UnityStrInf, UnityStrNegInf, UnityStrNaN, UnityStrDet};
    UNITY_INT should_be_trait = ((UNITY_INT)style & 1);
    UNITY_INT is_trait        = !should_be_trait;
    UNITY_INT trait_index     = (UNITY_INT)(style >> 1);

    RETURN_IF_FAIL_OR_IGNORE;

    switch (style)
    {
        case UNITY_FLOAT_IS_INF:
        case UNITY_FLOAT_IS_NOT_INF:
            is_trait = isinf(actual) && (actual > 0);
            break;
        case UNITY_FLOAT_IS_NEG_INF:
        case UNITY_FLOAT_IS_NOT_NEG_INF:
            is_trait = isinf(actual) && (actual < 0);
            break;

        case UNITY_FLOAT_IS_NAN:
        case UNITY_FLOAT_IS_NOT_NAN:
            is_trait = isnan(actual) ? 1 : 0;
            break;

        case UNITY_FLOAT_IS_DET: /* A determinate number is non infinite and not NaN. */
        case UNITY_FLOAT_IS_NOT_DET:
            is_trait = !isinf(actual) && !isnan(actual);
            break;

        default:
            trait_index = 0;
            trait_names[0] = UnityStrInvalidFloatTrait;
            break;
    }

    if (is_trait != should_be_trait)
    {
        UnityTestResultsFailBegin(lineNumber);
        UnityPrint(UnityStrExpected);
        if (!should_be_trait)
        {
            UnityPrint(UnityStrNot);
        }
        UnityPrint(trait_names[trait_index]);
        UnityPrint(UnityStrWas);
#ifndef UNITY_EXCLUDE_FLOAT_PRINT
        UnityPrintFloat((UNITY_DOUBLE)actual);
#else
        if (should_be_trait)
        {
            UnityPrint(UnityStrNot);
        }
        UnityPrint(trait_names[trait_index]);
#endif
        UnityAddMsgIfSpecified(msg);
        UNITY_FAIL_AND_BAIL;
    }
}